

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstring_view_archive.cpp
# Opt level: O0

void __thiscall
SStringViewArchive_Empty_Test::~SStringViewArchive_Empty_Test(SStringViewArchive_Empty_Test *this)

{
  SStringViewArchive_Empty_Test *this_local;
  
  ~SStringViewArchive_Empty_Test(this);
  operator_delete(this,0x150);
  return;
}

Assistant:

TEST_F (SStringViewArchive, Empty) {
    auto str = make_shared_sstring_view ("");

    // Append 'str'' to the store (we don't need to have committed the transaction to be able to
    // access its contents).
    mock_mutex mutex;
    auto transaction = begin (db_, std::unique_lock<mock_mutex>{mutex});
    auto const first = pstore::typed_address<char> (this->current_pos (transaction));
    pstore::serialize::write (pstore::serialize::archive::make_writer (transaction), str);

    auto const last = pstore::typed_address<char> (this->current_pos (transaction));
    EXPECT_THAT (as_vector (first, last), ::testing::ElementsAre ('\x1', '\x0'));

    // Now try reading it back and compare to the original string.
    {
        using namespace pstore::serialize;
        shared_sstring_view const actual =
            read<shared_sstring_view> (archive::database_reader{db_, first.to_address ()});
        EXPECT_EQ (actual, "");
    }
}